

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O3

void __thiscall
PenguinV_Image::ImageTemplate<unsigned_char>::clear(ImageTemplate<unsigned_char> *this)

{
  uchar *puVar1;
  FunctionFacade *this_00;
  _func_void_uchar_ptr *p_Var2;
  
  puVar1 = this->_data;
  if (puVar1 != (uchar *)0x0) {
    this_00 = FunctionFacade::instance();
    p_Var2 = __PenguinV_Image__ImageTemplate<unsigned_char>__FunctionFacade___getFunction<void(*)(unsigned_char*)>_std__vector<void(*)(unsigned_char*),std::allocator<void(*)(unsigned_char*)>>const__unsigned_char_const_
                       (this_00,&this_00->_deallocate,this->_type);
    (*p_Var2)(puVar1);
    this->_data = (uchar *)0x0;
  }
  this->_width = 0;
  this->_height = 0;
  this->_rowSize = 0;
  return;
}

Assistant:

void clear()
        {
            if( _data != nullptr ) {
                _deallocate( _data );
                _data = nullptr;
            }

            _width   = 0;
            _height  = 0;
            _rowSize = 0;
        }